

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int build_pathname_utf16be(uchar *p,size_t max,size_t *len,file_info *file)

{
  size_t *len_00;
  size_t __n;
  long lVar1;
  int iVar2;
  size_t sVar3;
  
  len_00 = (size_t *)len[1];
  if ((len_00 != (size_t *)0x0) && (len_00[0x19] != 0)) {
    iVar2 = build_pathname_utf16be(p,max,len_00,file);
    if (iVar2 != 0) {
      return -1;
    }
    p[*(long *)max] = '\0';
    p[*(long *)max + 1] = '/';
    *(long *)max = *(long *)max + 2;
  }
  __n = len[0x19];
  lVar1 = *(long *)max;
  if (__n == 0) {
    if (lVar1 - 0x3ffU < 0xfffffffffffffbff) {
      return -1;
    }
    p[lVar1] = '\0';
    p[*(long *)max + 1] = '.';
    sVar3 = 2;
  }
  else {
    if (0x400 < lVar1 + __n) {
      return -1;
    }
    memcpy(p + lVar1,(void *)len[0x18],__n);
    sVar3 = len[0x19];
  }
  *(size_t *)max = *(long *)max + sVar3;
  return 0;
}

Assistant:

static int
build_pathname_utf16be(unsigned char *p, size_t max, size_t *len,
    struct file_info *file)
{
	if (file->parent != NULL && file->parent->utf16be_bytes > 0) {
		if (build_pathname_utf16be(p, max, len, file->parent) != 0)
			return (-1);
		p[*len] = 0;
		p[*len + 1] = '/';
		*len += 2;
	}
	if (file->utf16be_bytes == 0) {
		if (*len + 2 > max)
			return (-1);/* Path is too long! */
		p[*len] = 0;
		p[*len + 1] = '.';
		*len += 2;
	} else {
		if (*len + file->utf16be_bytes > max)
			return (-1);/* Path is too long! */
		memcpy(p + *len, file->utf16be_name, file->utf16be_bytes);
		*len += file->utf16be_bytes;
	}
	return (0);
}